

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O2

void __thiscall flow::Value::removeUse(Value *this,Instr *user)

{
  __normal_iterator<flow::Instr_**,_std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>_>
  __position;
  Instr *user_local;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<flow::Instr**,std::vector<flow::Instr*,std::allocator<flow::Instr*>>>,__gnu_cxx::__ops::_Iter_equals_val<flow::Instr*const>>
                         ((this->uses_).
                          super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->uses_).
                          super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::erase
              (&this->uses_,(const_iterator)__position._M_current);
    return;
  }
  __assert_fail("i != uses_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/Value.cc"
                ,0x34,"void flow::Value::removeUse(Instr *)");
}

Assistant:

void Value::removeUse(Instr* user) {
  auto i = std::find(uses_.begin(), uses_.end(), user);

  assert(i != uses_.end());

  if (i != uses_.end()) {
    uses_.erase(i);
  }
}